

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall
sf::priv::WindowImplX11::WindowImplX11
          (WindowImplX11 *this,VideoMode mode,String *title,unsigned_long style,
          ContextSettings *settings)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  Display *pDVar4;
  ulong uVar5;
  Window WVar6;
  undefined8 *puVar7;
  Atom AVar8;
  ostream *poVar9;
  ulong uVar10;
  Vector2i VVar11;
  ssize_t sVar12;
  char *pcVar13;
  byte *pbVar14;
  long lVar15;
  size_type sVar16;
  uint uVar17;
  uint uVar18;
  Pixmap PVar19;
  long lVar20;
  uint uVar21;
  allocator_type local_151;
  Vector2i local_150;
  string ansiTitle;
  string executableName;
  vector<char,_std::allocator<char>_> windowClass;
  vector<char,_std::allocator<char>_> windowInstance;
  long flags;
  VideoMode local_b0;
  XSetWindowAttributes attributes;
  
  uVar10 = mode._0_8_;
  local_b0._0_8_ = uVar10;
  local_b0.bitsPerPixel = mode.bitsPerPixel;
  WindowImpl::WindowImpl(&this->super_WindowImpl);
  (this->super_WindowImpl)._vptr_WindowImpl = (_func_int **)&PTR__WindowImplX11_0027bbe0;
  this->m_window = 0;
  this->m_screen = 0;
  this->m_inputMethod = (XIM)0x0;
  this->m_inputContext = (XIC)0x0;
  this->m_isExternal = false;
  this->m_oldVideoMode = 0;
  this->m_oldRRCrtc = 0;
  this->m_hiddenCursor = 0;
  this->m_lastCursor = 0;
  this->m_keyRepeat = true;
  (this->m_previousSize).x = -1;
  (this->m_previousSize).y = -1;
  this->m_useSizeHints = false;
  bVar2 = (bool)((byte)((style & 0xffffffff) >> 3) & 1);
  this->m_fullscreen = bVar2;
  this->m_cursorGrabbed = bVar2;
  *(undefined8 *)&this->m_windowMapped = 0;
  *(undefined8 *)((long)&this->m_iconPixmap + 7) = 0;
  this->m_iconMaskPixmap = 0;
  this->m_lastInputTime = 0;
  pDVar4 = OpenDisplay();
  this->m_display = pDVar4;
  anon_unknown.dwarf_2f4052::WindowsImplX11Impl::ewmhSupported();
  iVar3 = *(int *)(this->m_display + 0xe0);
  this->m_screen = iVar3;
  uVar21 = mode.width;
  uVar18 = mode.height;
  if (this->m_fullscreen == true) {
    local_150 = getPrimaryMonitorPosition(this);
    uVar5 = (ulong)local_150 >> 0x20;
  }
  else {
    lVar20 = *(long *)(this->m_display + 0xe8);
    lVar15 = (long)iVar3 * 0x80;
    local_150 = (Vector2i)((long)(int)(*(int *)(lVar20 + 0x18 + lVar15) - uVar21) / 2 & 0xffffffff);
    uVar5 = (long)(int)(*(int *)(lVar20 + 0x1c + lVar15) - uVar18) / 2 & 0xffffffff;
  }
  if (settings->attributeFlags == 0xffffffff) {
    pDVar4 = this->m_display;
    lVar20 = *(long *)(pDVar4 + 0xe8);
    lVar15 = (long)this->m_screen * 0x80;
    PVar19 = *(Pixmap *)(lVar20 + 0x40 + lVar15);
    uVar1 = *(undefined4 *)(lVar20 + 0x38 + lVar15);
  }
  else {
    GlxContext::selectBestVisual
              ((XVisualInfo *)&attributes,this->m_display,mode.bitsPerPixel,settings);
    pDVar4 = this->m_display;
    lVar20 = *(long *)(pDVar4 + 0xe8);
    PVar19 = attributes.background_pixmap;
    uVar1 = attributes.border_pixmap._4_4_;
  }
  uVar17 = 0;
  attributes.colormap =
       XCreateColormap(pDVar4,*(undefined8 *)(lVar20 + 0x10 + (long)*(int *)(pDVar4 + 0xe0) * 0x80),
                       PVar19,0);
  attributes.event_mask = 0x63207f;
  if (this->m_fullscreen == true) {
    bVar2 = anon_unknown.dwarf_2f4052::WindowsImplX11Impl::ewmhSupported();
    uVar17 = (uint)!bVar2;
  }
  pDVar4 = this->m_display;
  attributes.override_redirect = uVar17;
  WVar6 = XCreateWindow(pDVar4,*(undefined8 *)
                                (*(long *)(pDVar4 + 0xe8) + 0x10 +
                                (long)*(int *)(pDVar4 + 0xe0) * 0x80),local_150,uVar5,
                        uVar10 & 0xffffffff,uVar10 >> 0x20,0,uVar1,1,PVar19,0x2a00,&attributes);
  this->m_window = WVar6;
  if (WVar6 == 0) {
    poVar9 = err();
    poVar9 = std::operator<<(poVar9,"Failed to create window");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  else {
    setProtocols(this);
    puVar7 = (undefined8 *)XAllocWMHints();
    *puVar7 = 2;
    *(undefined4 *)((long)puVar7 + 0xc) = 1;
    XSetWMHints(this->m_display,this->m_window,puVar7);
    XFree(puVar7);
    if (this->m_fullscreen == false) {
      std::__cxx11::string::string
                ((string *)&executableName,"_MOTIF_WM_HINTS",(allocator *)&ansiTitle);
      AVar8 = getAtom(&executableName,false);
      std::__cxx11::string::~string((string *)&executableName);
      if (AVar8 != 0) {
        executableName.field_2._8_8_ = 0;
        executableName._M_dataplus._M_p = (pointer)0x3;
        executableName._M_string_length = 0;
        executableName.field_2._M_allocated_capacity = 0;
        if ((style & 1) == 0) {
          uVar10 = 0;
          sVar16 = 0x44;
        }
        else {
          executableName.field_2._M_allocated_capacity = 0x3a;
          executableName._M_string_length = 0xc;
          sVar16 = 0x7e;
          uVar10 = 0xc;
        }
        if ((style & 2) != 0) {
          uVar10 = uVar10 | 0x12;
          executableName._M_string_length = uVar10;
          executableName.field_2._M_allocated_capacity = sVar16;
        }
        if ((style & 4) != 0) {
          executableName._M_string_length = uVar10 | 0x20;
        }
        XChangeProperty(this->m_display,this->m_window,AVar8,AVar8,0x20,0,&executableName);
      }
    }
    if ((style & 2) == 0) {
      this->m_useSizeHints = true;
      puVar7 = (undefined8 *)XAllocSizeHints();
      *puVar7 = 0x31;
      *(uint *)(puVar7 + 4) = uVar21;
      *(uint *)(puVar7 + 3) = uVar21;
      *(uint *)((long)puVar7 + 0x24) = uVar18;
      *(uint *)((long)puVar7 + 0x1c) = uVar18;
      *(int *)(puVar7 + 1) = local_150.x;
      *(int *)((long)puVar7 + 0xc) = (int)uVar5;
      XSetWMNormalHints(this->m_display,this->m_window,puVar7);
      XFree(puVar7);
    }
    VVar11 = (Vector2i)XAllocClassHint();
    iVar3 = open("/proc/self/cmdline",0x800);
    if (iVar3 < 0) {
      std::__cxx11::string::string((string *)&executableName,"sfml",(allocator *)&ansiTitle);
    }
    else {
      windowInstance.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start._0_1_ = 0;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&ansiTitle,0x100,
                 (value_type *)&windowInstance,(allocator_type *)&windowClass);
      lVar20 = 0;
      local_150 = VVar11;
      while( true ) {
        sVar12 = read(iVar3,(void *)(CONCAT71(ansiTitle._M_dataplus._M_p._1_7_,
                                              ansiTitle._M_dataplus._M_p._0_1_) + lVar20),0x100);
        if (sVar12 < 1) break;
        windowInstance.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = 0;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&ansiTitle,
                   (ansiTitle._M_string_length + sVar12) -
                   CONCAT71(ansiTitle._M_dataplus._M_p._1_7_,ansiTitle._M_dataplus._M_p._0_1_),
                   (value_type *)&windowInstance);
        lVar20 = lVar20 + sVar12;
      }
      close(iVar3);
      if (lVar20 == 0) {
        std::__cxx11::string::string((string *)&executableName,"sfml",(allocator *)&windowInstance);
      }
      else {
        *(undefined1 *)
         (CONCAT71(ansiTitle._M_dataplus._M_p._1_7_,ansiTitle._M_dataplus._M_p._0_1_) + lVar20) = 0;
        pcVar13 = __xpg_basename((char *)CONCAT71(ansiTitle._M_dataplus._M_p._1_7_,
                                                  ansiTitle._M_dataplus._M_p._0_1_));
        std::__cxx11::string::string((string *)&executableName,pcVar13,(allocator *)&windowInstance)
        ;
      }
      VVar11 = local_150;
      Catch::clara::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&ansiTitle);
    }
    ansiTitle._M_dataplus._M_p._0_1_ = 0;
    std::vector<char,_std::allocator<char>_>::vector
              (&windowInstance,executableName._M_string_length + 1,(value_type *)&ansiTitle,
               (allocator_type *)&windowClass);
    if (executableName._M_string_length != 0) {
      memmove((void *)CONCAT71(windowInstance.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               windowInstance.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_),
              executableName._M_dataplus._M_p,executableName._M_string_length);
    }
    *(ulong *)VVar11 =
         CONCAT71(windowInstance.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start._1_7_,
                  windowInstance.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_);
    std::locale::locale((locale *)&windowClass);
    String::toAnsiString_abi_cxx11_(&ansiTitle,title,(locale *)&windowClass);
    std::locale::~locale((locale *)&windowClass);
    flags = flags & 0xffffffffffffff00;
    std::vector<char,_std::allocator<char>_>::vector
              (&windowClass,ansiTitle._M_string_length + 1,(value_type *)&flags,&local_151);
    if (ansiTitle._M_string_length != 0) {
      memmove(windowClass.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,
              (void *)CONCAT71(ansiTitle._M_dataplus._M_p._1_7_,ansiTitle._M_dataplus._M_p._0_1_),
              ansiTitle._M_string_length);
    }
    *(pointer *)((long)VVar11 + 8) =
         windowClass.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
         ._M_start;
    XSetClassHint(this->m_display,this->m_window,VVar11);
    XFree(VVar11);
    (*(this->super_WindowImpl)._vptr_WindowImpl[7])(this,title);
    initialize(this);
    if (this->m_fullscreen == true) {
      pbVar14 = (byte *)XAllocSizeHints();
      flags = 0;
      XGetWMNormalHints(this->m_display,this->m_window,pbVar14);
      *pbVar14 = *pbVar14 & 0xcf;
      XSetWMNormalHints(this->m_display,this->m_window,pbVar14);
      XFree(pbVar14);
      setVideoMode(this,&local_b0);
      switchToFullscreen(this);
    }
    Catch::clara::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&windowClass);
    std::__cxx11::string::~string((string *)&ansiTitle);
    Catch::clara::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&windowInstance);
    std::__cxx11::string::~string((string *)&executableName);
  }
  return;
}

Assistant:

WindowImplX11::WindowImplX11(VideoMode mode, const String& title, unsigned long style, const ContextSettings& settings) :
m_window         (0),
m_screen         (0),
m_inputMethod    (NULL),
m_inputContext   (NULL),
m_isExternal     (false),
m_oldVideoMode   (0),
m_oldRRCrtc      (0),
m_hiddenCursor   (0),
m_lastCursor     (None),
m_keyRepeat      (true),
m_previousSize   (-1, -1),
m_useSizeHints   (false),
m_fullscreen     ((style & Style::Fullscreen) != 0),
m_cursorGrabbed  (m_fullscreen),
m_windowMapped   (false),
m_iconPixmap     (0),
m_iconMaskPixmap (0),
m_lastInputTime  (0)
{
    using namespace WindowsImplX11Impl;

    // Open a connection with the X server
    m_display = OpenDisplay();

    // Make sure to check for EWMH support before we do anything
    ewmhSupported();

    m_screen = DefaultScreen(m_display);

    // Compute position and size
    Vector2i windowPosition;
    if(m_fullscreen)
    {
        windowPosition = getPrimaryMonitorPosition();
    }
    else
    {
        windowPosition.x = (DisplayWidth(m_display, m_screen) - static_cast<int>(mode.width))  / 2;
        windowPosition.y = (DisplayHeight(m_display, m_screen) - static_cast<int>(mode.height)) / 2;
    }

    unsigned int width  = mode.width;
    unsigned int height = mode.height;

    Visual* visual = NULL;
    int depth = 0;

    // Check if the user chose to not create an OpenGL context (settings.attributeFlags will be 0xFFFFFFFF)
    if (settings.attributeFlags == 0xFFFFFFFF)
    {
        // Choose default visual since the user is going to use their own rendering API
        visual = DefaultVisual(m_display, m_screen);
        depth = DefaultDepth(m_display, m_screen);
    }
    else
    {
        // Choose the visual according to the context settings
        XVisualInfo visualInfo = ContextType::selectBestVisual(m_display, mode.bitsPerPixel, settings);

        visual = visualInfo.visual;
        depth = visualInfo.depth;
    }

    // Define the window attributes
    XSetWindowAttributes attributes;
    attributes.colormap = XCreateColormap(m_display, DefaultRootWindow(m_display), visual, AllocNone);
    attributes.event_mask = eventMask;
    attributes.override_redirect = (m_fullscreen && !ewmhSupported()) ? True : False;

    m_window = XCreateWindow(m_display,
                             DefaultRootWindow(m_display),
                             windowPosition.x, windowPosition.y,
                             width, height,
                             0,
                             depth,
                             InputOutput,
                             visual,
                             CWEventMask | CWOverrideRedirect | CWColormap,
                             &attributes);

    if (!m_window)
    {
        err() << "Failed to create window" << std::endl;
        return;
    }

    // Set the WM protocols
    setProtocols();

    // Set the WM initial state to the normal state
    XWMHints* xHints = XAllocWMHints();
    xHints->flags         = StateHint;
    xHints->initial_state = NormalState;
    XSetWMHints(m_display, m_window, xHints);
    XFree(xHints);

    // If not in fullscreen, set the window's style (tell the window manager to
    // change our window's decorations and functions according to the requested style)
    if (!m_fullscreen)
    {
        Atom WMHintsAtom = getAtom("_MOTIF_WM_HINTS", false);
        if (WMHintsAtom)
        {
            static const unsigned long MWM_HINTS_FUNCTIONS   = 1 << 0;
            static const unsigned long MWM_HINTS_DECORATIONS = 1 << 1;

            //static const unsigned long MWM_DECOR_ALL         = 1 << 0;
            static const unsigned long MWM_DECOR_BORDER      = 1 << 1;
            static const unsigned long MWM_DECOR_RESIZEH     = 1 << 2;
            static const unsigned long MWM_DECOR_TITLE       = 1 << 3;
            static const unsigned long MWM_DECOR_MENU        = 1 << 4;
            static const unsigned long MWM_DECOR_MINIMIZE    = 1 << 5;
            static const unsigned long MWM_DECOR_MAXIMIZE    = 1 << 6;

            //static const unsigned long MWM_FUNC_ALL          = 1 << 0;
            static const unsigned long MWM_FUNC_RESIZE       = 1 << 1;
            static const unsigned long MWM_FUNC_MOVE         = 1 << 2;
            static const unsigned long MWM_FUNC_MINIMIZE     = 1 << 3;
            static const unsigned long MWM_FUNC_MAXIMIZE     = 1 << 4;
            static const unsigned long MWM_FUNC_CLOSE        = 1 << 5;

            struct WMHints
            {
                unsigned long flags;
                unsigned long functions;
                unsigned long decorations;
                long          inputMode;
                unsigned long state;
            };

            WMHints hints;
            std::memset(&hints, 0, sizeof(hints));
            hints.flags       = MWM_HINTS_FUNCTIONS | MWM_HINTS_DECORATIONS;
            hints.decorations = 0;
            hints.functions   = 0;

            if (style & Style::Titlebar)
            {
                hints.decorations |= MWM_DECOR_BORDER | MWM_DECOR_TITLE | MWM_DECOR_MINIMIZE | MWM_DECOR_MENU;
                hints.functions   |= MWM_FUNC_MOVE | MWM_FUNC_MINIMIZE;
            }
            if (style & Style::Resize)
            {
                hints.decorations |= MWM_DECOR_MAXIMIZE | MWM_DECOR_RESIZEH;
                hints.functions   |= MWM_FUNC_MAXIMIZE | MWM_FUNC_RESIZE;
            }
            if (style & Style::Close)
            {
                hints.decorations |= 0;
                hints.functions   |= MWM_FUNC_CLOSE;
            }

            XChangeProperty(m_display,
                            m_window,
                            WMHintsAtom,
                            WMHintsAtom,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&hints),
                            5);
        }
    }

    // This is a hack to force some windows managers to disable resizing
    if (!(style & Style::Resize))
    {
        m_useSizeHints = true;
        XSizeHints* sizeHints = XAllocSizeHints();
        sizeHints->flags = PMinSize | PMaxSize | USPosition;
        sizeHints->min_width  = sizeHints->max_width  = static_cast<int>(width);
        sizeHints->min_height = sizeHints->max_height = static_cast<int>(height);
        sizeHints->x = windowPosition.x;
        sizeHints->y = windowPosition.y;
        XSetWMNormalHints(m_display, m_window, sizeHints);
        XFree(sizeHints);
    }

    // Set the window's WM class (this can be used by window managers)
    XClassHint* hint = XAllocClassHint();

    // The instance name should be something unique to this invocation
    // of the application but is rarely if ever used these days.
    // For simplicity, we retrieve it via the base executable name.
    std::string executableName = findExecutableName();
    std::vector<char> windowInstance(executableName.size() + 1, 0);
    std::copy(executableName.begin(), executableName.end(), windowInstance.begin());
    hint->res_name = &windowInstance[0];

    // The class name identifies a class of windows that
    // "are of the same type". We simply use the initial window name as
    // the class name.
    std::string ansiTitle = title.toAnsiString();
    std::vector<char> windowClass(ansiTitle.size() + 1, 0);
    std::copy(ansiTitle.begin(), ansiTitle.end(), windowClass.begin());
    hint->res_class = &windowClass[0];

    XSetClassHint(m_display, m_window, hint);

    XFree(hint);

    // Set the window's name
    setTitle(title);

    // Do some common initializations
    initialize();

    // Set fullscreen video mode and switch to fullscreen if necessary
    if (m_fullscreen)
    {
        // Disable hint for min and max size,
        // otherwise some windows managers will not remove window decorations
        XSizeHints *sizeHints = XAllocSizeHints();
        long flags = 0;
        XGetWMNormalHints(m_display, m_window, sizeHints, &flags);
        sizeHints->flags &= ~(PMinSize | PMaxSize);
        XSetWMNormalHints(m_display, m_window, sizeHints);
        XFree(sizeHints);

        setVideoMode(mode);
        switchToFullscreen();
    }
}